

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O1

shared_ptr<rcg::Device> __thiscall
rcg::Interface::getDevice(Interface *this,char *devid,uint64_t timeout)

{
  __weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *_gentl;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  bool bVar3;
  enable_shared_from_this<rcg::Interface> *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *peVar6;
  __weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *__r;
  int iVar7;
  string *psVar8;
  size_t sVar9;
  Device *pDVar10;
  uint64_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  shared_ptr<rcg::Device> sVar14;
  shared_ptr<rcg::Device> p;
  DEV_HANDLE dev;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> list;
  Device *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  element_type *local_b0;
  __weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *local_a8;
  shared_ptr<rcg::Interface> local_a0;
  DEV_HANDLE local_90;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_88;
  string local_70;
  string local_50;
  
  local_a8 = (__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)devid;
  getDevices(&local_88,(Interface *)devid,in_RCX);
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
  super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b0 = (element_type *)this;
  if (local_88.
      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.
      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    peVar4 = &this->super_enable_shared_from_this<rcg::Interface>;
    lVar11 = 8;
    uVar12 = 0;
    do {
      local_c8 = *(Device **)
                  ((long)local_88.
                         super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
      a_Stack_c0[0]._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&((local_88.
                      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar11);
      if (a_Stack_c0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (a_Stack_c0[0]._M_pi)->_M_use_count = (a_Stack_c0[0]._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (a_Stack_c0[0]._M_pi)->_M_use_count = (a_Stack_c0[0]._M_pi)->_M_use_count + 1;
        }
      }
      if (local_c8 == (Device *)0x0) {
        bVar3 = false;
        bVar2 = false;
        bVar13 = false;
      }
      else {
        psVar8 = Device::getID_abi_cxx11_(local_c8);
        iVar7 = std::__cxx11::string::compare((char *)psVar8);
        if (iVar7 == 0) {
          bVar13 = true;
          bVar3 = false;
          bVar2 = false;
        }
        else {
          Device::getDisplayName_abi_cxx11_(&local_70,local_c8);
          iVar7 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar7 == 0) {
            bVar3 = true;
            bVar2 = false;
            bVar13 = true;
          }
          else {
            Device::getSerialNumber_abi_cxx11_(&local_50,local_c8);
            iVar7 = std::__cxx11::string::compare((char *)&local_50);
            bVar13 = iVar7 == 0;
            bVar3 = true;
            bVar2 = true;
          }
        }
      }
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this = (Interface *)local_b0;
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2)) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar13) {
        if ((((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
            super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
        {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "There is more than one device with ID, serial number or user defined name: ",
                     0x4b);
          if (timeout == 0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x147718);
          }
          else {
            sVar9 = strlen((char *)timeout);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(char *)timeout,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
          std::ostream::put('\x18');
          std::ostream::flush();
          p_Var1 = (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this
                   .super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          if (a_Stack_c0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_c0[0]._M_pi);
          }
          break;
        }
        (((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
        super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &(peVar4->_M_weak_this).
                    super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   a_Stack_c0);
      }
      if (a_Stack_c0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_c0[0]._M_pi);
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 < (ulong)((long)local_88.
                                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88.
                                    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  __r = local_a8;
  if (((((element_type *)this)->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
       super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) &&
     (local_a8[8]._M_ptr != (element_type *)0x0)) {
    local_90 = (DEV_HANDLE)0x0;
    iVar7 = (*(code *)local_a8[2]._M_ptr[1].gentl.
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)(local_a8[8]._M_ptr,timeout,2);
    _gentl = __r + 2;
    if (1 < iVar7 + 0x3edU) {
      this = (Interface *)local_b0;
      if (iVar7 != 0) goto LAB_00119880;
      (*((__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> *)&_gentl->_M_ptr)->
        _M_ptr->DevClose)(local_90);
    }
    pDVar10 = (Device *)operator_new(0x130);
    peVar6 = local_b0;
    std::__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Interface,void>
              ((__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2> *)&local_a0,__r);
    Device::Device(pDVar10,&local_a0,(shared_ptr<const_rcg::GenTLWrapper> *)_gentl,(char *)timeout);
    std::__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Device,void>
              ((__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> *)&local_c8,pDVar10);
    _Var5._M_pi = a_Stack_c0[0]._M_pi;
    pDVar10 = local_c8;
    local_c8 = (Device *)0x0;
    a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (peVar6->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
             super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (peVar6->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
    super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pDVar10;
    (peVar6->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
    super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_c0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_c0[0]._M_pi);
    }
    this = (Interface *)local_b0;
    if (local_a0.super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      this = (Interface *)local_b0;
    }
  }
LAB_00119880:
  std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::~vector
            (&local_88);
  sVar14.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar14.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<rcg::Device>)sVar14.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Device> Interface::getDevice(const char *devid, uint64_t timeout)
{
  // get list of all devices

  std::vector<std::shared_ptr<Device> > list=getDevices(timeout);

  // find requested device by ID or user defined name

  std::shared_ptr<Device> ret;

  for (size_t i=0; i<list.size(); i++)
  {
    std::shared_ptr<Device> p=list[i];

    if (p && (p->getID() == devid || p->getDisplayName() == devid ||
              p->getSerialNumber() == devid))
    {
      if (ret)
      {
        std::cerr << "There is more than one device with ID, serial number or user defined name: "
                  << devid << std::endl;
        ret=0;
        break;
      }

      ret=p;
    }
  }

  if (!ret && ifh != 0)
  {
    // try to open the device in a last attempt to check if the producer is
    // able to find it

    GenTL::DEV_HANDLE dev=0;

    GenTL::GC_ERROR err=gentl->IFOpenDevice(ifh, devid, GenTL::DEVICE_ACCESS_READONLY, &dev);

    if (err == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DevClose(dev);
    }

    if (err == GenTL::GC_ERR_SUCCESS || err == GenTL::GC_ERR_RESOURCE_IN_USE ||
        err == GenTL::GC_ERR_ACCESS_DENIED)
    {
      ret=std::shared_ptr<Device>(new Device(shared_from_this(), gentl, devid));
    }
  }

  return ret;
}